

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith.hpp
# Opt level: O2

size_t interp_decompress(uint32_t *obuff,size_t osize,uint8_t *ibuff,size_t isize)

{
  uint64_t max;
  pointer puVar1;
  pointer puVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  size_type __n;
  size_t sVar6;
  uint64_t v;
  uint32_t *local_58;
  uint8_t *local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> T;
  
  __n = osize * 2 - 1;
  local_58 = obuff;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&T,__n,(allocator_type *)&v);
  local_50 = ibuff;
  sVar3 = byte_decode(ibuff,__n,0x8000000000000000,
                      T.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
  puVar2 = T.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = T.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (sVar6 = 1; osize != sVar6; sVar6 = sVar6 + 1) {
    max = puVar2[sVar6 - 1];
    sVar4 = byte_decode(local_50 + sVar3,__n,max,&v);
    if ((v + max & 1) == 0) {
      uVar5 = (max - v >> 1) + 1;
    }
    else {
      uVar5 = v + max + 1 >> 1;
    }
    sVar3 = sVar3 + sVar4;
    puVar1[1] = uVar5;
    puVar1[2] = (max - uVar5) + 1;
    puVar1 = puVar1 + 2;
  }
  for (sVar6 = 0; osize != sVar6; sVar6 = sVar6 + 1) {
    local_58[sVar6] =
         (uint32_t)
         T.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start[osize + (sVar6 - 1)];
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&T.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return sVar3;
}

Assistant:

size_t interp_decompress(uint32_t* obuff, /* output buffer */
    size_t osize, /* number symbols to be decoded */
    const uint8_t* ibuff, /* input buffer */
    size_t isize)
{ /* size of input buffer */
    int i, p;
    uint64_t vp, vl, vr, v;
    size_t ip = 0;

    std::vector<uint64_t> T(2 * osize - 1);
    ip += byte_decode(ibuff + ip, isize - ip, (1LL << 63), T.data());
    for (p = 0; p < osize - 1; p++) {
        vp = T[p];
        ip += byte_decode(ibuff + ip, isize - ip, vp, &v);
        if (((v + vp) & 1) == 0) {
            vl = 1 + ((vp - v) >> 1);
        } else {
            vl = (vp + v + 1) >> 1;
        }
        vr = vp - vl + 1;
        T[2 * p + 1] = vl;
        T[2 * p + 2] = vr;
    }
    for (i = 0; i < osize; i++) {
        obuff[i] = T[i + osize - 1];
    }
    return ip;
}